

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

errc psql::deserialize<psql::row_description>(row_description *output,deserialization_context *ctx)

{
  errc eVar1;
  
  eVar1 = serialization_traits<psql::row_description,_(psql::serialization_tag)0>::deserialize_
                    (output,ctx);
  return eVar1;
}

Assistant:

errc deserialize(T& output, deserialization_context& ctx) noexcept
{
	return serialization_traits<T>::deserialize_(output, ctx);
}